

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis_weighted<double,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  ulong *puVar1;
  double __x;
  double __y;
  long *plVar2;
  double *Xc_00;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  double dVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long *plVar13;
  ulong *puVar14;
  size_t *key;
  ulong *key_00;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar15;
  tuple<> local_c1;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  long *local_88;
  double *local_80;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_78;
  long local_70;
  size_t *local_68;
  size_t local_60;
  double local_58;
  size_t local_50;
  long local_48;
  size_t *local_40;
  size_t local_38;
  
  local_c0 = (double)Xc_indptr[col_num];
  local_70 = Xc_indptr[col_num + 1];
  if (end < st || local_c0 == (double)local_70) {
    return -INFINITY;
  }
  key = ix_arr + st;
  local_b8 = 0.0;
  local_88 = Xc_ind;
  local_80 = Xc;
  local_68 = ix_arr;
  local_50 = st;
  local_38 = col_num;
  do {
    local_78._M_head_impl = key;
    pVar15 = tsl::detail_robin_hash::
             robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
             ::
             insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                       ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                         *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                        (tuple<const_unsigned_long_&> *)&local_78,&local_c1);
    lVar3 = local_70;
    plVar2 = local_88;
    local_b8 = local_b8 + *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
    st = st + 1;
    key = key + 1;
  } while (st <= end);
  if (local_b8 <= 0.0) {
    return -INFINITY;
  }
  key_00 = local_68 + local_50;
  puVar14 = local_68 + end + 1;
  uVar5 = (long)puVar14 - (long)key_00 >> 3;
  if (0 < (long)uVar5) {
    do {
      uVar6 = uVar5 >> 1;
      uVar9 = ~uVar6 + uVar5;
      uVar5 = uVar6;
      if (key_00[uVar6] < (ulong)local_88[(long)local_c0]) {
        key_00 = key_00 + uVar6 + 1;
        uVar5 = uVar9;
      }
    } while (0 < (long)uVar5);
  }
  local_48 = local_70 + -1;
  uVar5 = local_88[local_70 + -1];
  local_40 = local_68 + end;
  plVar13 = local_88;
  local_60 = end;
  if (missing_action == Fail) {
    if (key_00 == puVar14) {
      return -INFINITY;
    }
    local_b0 = 0.0;
    local_90 = 0.0;
    local_98 = 0.0;
    lVar12 = local_70;
    dVar8 = local_c0;
    local_c0 = 0.0;
    while (uVar6 = *key_00, uVar6 <= uVar5) {
      puVar1 = (ulong *)(plVar13 + (long)dVar8);
      uVar9 = *puVar1;
      if (uVar9 == uVar6) {
        local_78._M_head_impl = key_00;
        pVar15 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_78,&local_c1);
        local_a0 = *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
        local_58 = local_80[(long)dVar8];
        local_a8 = local_58 * local_58;
        local_c0 = fma(local_a0,local_58,local_c0);
        local_b0 = fma(local_a0,local_a8,local_b0);
        local_90 = fma(local_a0,local_58 * local_a8,local_90);
        local_98 = fma(local_a0,local_a8 * local_a8,local_98);
        plVar13 = local_88;
        if ((key_00 == local_40) || (dVar8 == (double)local_48)) break;
        puVar7 = puVar1 + 1;
        key_00 = key_00 + 1;
        uVar6 = (long)plVar2 + (lVar3 * 8 - (long)puVar7) >> 3;
        lVar12 = local_70;
        if (0 < (long)uVar6) {
          do {
            uVar9 = uVar6 >> 1;
            uVar10 = ~uVar9 + uVar6;
            uVar6 = uVar9;
            if (puVar7[uVar9] < *key_00) {
              puVar7 = puVar7 + uVar9 + 1;
              uVar6 = uVar10;
            }
          } while (0 < (long)uVar6);
        }
LAB_0012ccea:
        dVar8 = (double)((long)puVar7 - (long)plVar13 >> 3);
      }
      else {
        if ((long)uVar9 <= (long)uVar6) {
          puVar7 = puVar1 + 1;
          uVar9 = (long)plVar2 + (lVar3 * 8 - (long)(puVar1 + 1)) >> 3;
          while (0 < (long)uVar9) {
            uVar10 = uVar9 >> 1;
            uVar11 = ~uVar10 + uVar9;
            uVar9 = uVar10;
            if (puVar7[uVar10] < uVar6) {
              puVar7 = puVar7 + uVar10 + 1;
              uVar9 = uVar11;
            }
          }
          goto LAB_0012ccea;
        }
        key_00 = key_00 + 1;
        uVar6 = (long)puVar14 - (long)key_00 >> 3;
        while (0 < (long)uVar6) {
          uVar10 = uVar6 >> 1;
          uVar11 = ~uVar10 + uVar6;
          uVar6 = uVar10;
          if (key_00[uVar10] < uVar9) {
            key_00 = key_00 + uVar10 + 1;
            uVar6 = uVar11;
          }
        }
      }
      if ((key_00 == puVar14) || (dVar8 == (double)lVar12)) break;
    }
  }
  else {
    if (key_00 == puVar14) {
      local_98 = 0.0;
      local_90 = 0.0;
      local_b0 = 0.0;
      local_c0 = 0.0;
    }
    else {
      local_b0 = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      lVar12 = local_70;
      dVar8 = local_c0;
      local_c0 = 0.0;
      while (uVar6 = *key_00, uVar6 <= uVar5) {
        puVar1 = (ulong *)(plVar13 + (long)dVar8);
        uVar9 = *puVar1;
        if (uVar9 == uVar6) {
          local_78._M_head_impl = key_00;
          pVar15 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_78,&local_c1);
          __x = *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
          __y = local_80[(long)dVar8];
          if ((ulong)ABS(__y) < 0x7ff0000000000000) {
            local_a8 = __y * __y;
            local_a0 = __x;
            local_58 = __y;
            local_c0 = fma(__x,__y,local_c0);
            local_b0 = fma(local_a0,local_a8,local_b0);
            local_90 = fma(local_a0,local_58 * local_a8,local_90);
            local_98 = fma(local_a0,local_a8 * local_a8,local_98);
          }
          else {
            local_b8 = local_b8 - __x;
          }
          plVar13 = local_88;
          if ((key_00 == local_40) || (dVar8 == (double)local_48)) break;
          puVar7 = puVar1 + 1;
          key_00 = key_00 + 1;
          uVar6 = (long)plVar2 + (lVar3 * 8 - (long)puVar7) >> 3;
          lVar12 = local_70;
          if (0 < (long)uVar6) {
            do {
              uVar9 = uVar6 >> 1;
              uVar10 = ~uVar9 + uVar6;
              uVar6 = uVar9;
              if (puVar7[uVar9] < *key_00) {
                puVar7 = puVar7 + uVar9 + 1;
                uVar6 = uVar10;
              }
            } while (0 < (long)uVar6);
          }
LAB_0012ca84:
          dVar8 = (double)((long)puVar7 - (long)plVar13 >> 3);
        }
        else {
          if ((long)uVar9 <= (long)uVar6) {
            puVar7 = puVar1 + 1;
            uVar9 = (long)plVar2 + (lVar3 * 8 - (long)(puVar1 + 1)) >> 3;
            while (0 < (long)uVar9) {
              uVar10 = uVar9 >> 1;
              uVar11 = ~uVar10 + uVar9;
              uVar9 = uVar10;
              if (puVar7[uVar10] < uVar6) {
                puVar7 = puVar7 + uVar10 + 1;
                uVar9 = uVar11;
              }
            }
            goto LAB_0012ca84;
          }
          key_00 = key_00 + 1;
          uVar6 = (long)puVar14 - (long)key_00 >> 3;
          while (0 < (long)uVar6) {
            uVar10 = uVar6 >> 1;
            uVar11 = ~uVar10 + uVar6;
            uVar6 = uVar10;
            if (key_00[uVar10] < uVar9) {
              key_00 = key_00 + uVar10 + 1;
              uVar6 = uVar11;
            }
          }
        }
        if ((key_00 == puVar14) || (dVar8 == (double)lVar12)) break;
      }
    }
    if (local_b8 <= 0.0) {
      return -INFINITY;
    }
  }
  Xc_00 = local_80;
  if ((1.0 < local_b8) && ((local_b0 != 0.0 || (NAN(local_b0))))) {
    if ((local_b0 != local_c0 * local_c0) || (NAN(local_b0) || NAN(local_c0 * local_c0))) {
      local_80 = (double *)(local_c0 / local_b8);
      local_a0 = (double)local_80 * (double)local_80;
      local_a8 = local_b0 / local_b8 - local_a0;
      if ((!NAN(local_a8)) &&
         ((2.220446049250313e-16 < local_a8 ||
          (bVar4 = check_more_than_two_unique_values<double,long>
                             (local_68,local_50,local_60,local_38,Xc_indptr,plVar13,Xc_00,
                              missing_action), bVar4)))) {
        if (local_a8 <= 0.0) {
          return 0.0;
        }
        dVar8 = (local_a0 * (double)local_80 * (double)local_80 * local_b8 +
                local_c0 * -4.0 * local_a0 * (double)local_80 +
                local_b0 * 6.0 * local_a0 + local_90 * -4.0 * (double)local_80 + local_98) /
                (local_a8 * local_a8 * local_b8);
        if ((long)ABS(dVar8) < 0x7ff0000000000000) {
          if (dVar8 <= 0.0) {
            return 0.0;
          }
          return dVar8;
        }
        return -INFINITY;
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}